

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O1

HCOSE_RECIPIENT COSE_Mac_GetRecipient(HCOSE_MAC cose,int iRecipient,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_RECIPIENT p_Var2;
  COSE_MacMessage *p;
  
  _Var1 = _COSE_IsInList(MacRoot,(COSE *)cose);
  if (_Var1) {
    p_Var2 = *(HCOSE_RECIPIENT *)(cose + 0x58);
    if (0 < iRecipient) {
      do {
        if (p_Var2 == (HCOSE_RECIPIENT)0x0) {
          if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_NO_RECIPIENT_FOUND;
          }
          goto LAB_001fb58d;
        }
        p_Var2 = *(HCOSE_RECIPIENT *)(p_Var2 + 0x70);
        iRecipient = iRecipient + -1;
      } while (iRecipient != 0);
    }
    if (p_Var2 != (HCOSE_RECIPIENT)0x0) {
      *(int *)(p_Var2 + 0x10) = *(int *)(p_Var2 + 0x10) + 1;
    }
  }
  else {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
LAB_001fb58d:
    p_Var2 = (HCOSE_RECIPIENT)0x0;
  }
  return p_Var2;
}

Assistant:

HCOSE_RECIPIENT COSE_Mac_GetRecipient(HCOSE_MAC cose, int iRecipient, cose_errback * perr)
{
	int i;
	COSE_RecipientInfo * p;

	CHECK_CONDITION(IsValidMacHandle(cose), COSE_ERR_INVALID_PARAMETER);

	p = ((COSE_MacMessage *)cose)->m_recipientFirst;
	for (i = 0; i < iRecipient; i++) {
		CHECK_CONDITION(p != NULL, COSE_ERR_NO_RECIPIENT_FOUND);
		p = p->m_recipientNext;
	}
	if (p != NULL) p->m_encrypt.m_message.m_refCount++;
	return (HCOSE_RECIPIENT)p;

errorReturn:
	return NULL;
}